

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_smoothStep_vec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar16;
  float fVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar18;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  fVar13 = c->in[1].m_data[0];
  fVar16 = c->in[1].m_data[1];
  fVar17 = c->in[1].m_data[2];
  fVar18 = c->in[1].m_data[3];
  fVar5 = c->in[2].m_data[0];
  fVar6 = c->in[2].m_data[1];
  fVar7 = c->in[2].m_data[2];
  fVar8 = c->in[2].m_data[3];
  uVar9 = -(uint)(fVar18 <= fVar5);
  uVar10 = -(uint)(fVar17 <= fVar8);
  uVar11 = -(uint)(fVar16 <= fVar7);
  uVar12 = -(uint)(fVar13 <= fVar6);
  auVar14._0_4_ = fVar5 - fVar2;
  auVar14._4_4_ = fVar8 - fVar3;
  auVar14._8_4_ = fVar7 - fVar4;
  auVar14._12_4_ = fVar6 - fVar1;
  auVar15._4_4_ = fVar17 - fVar3;
  auVar15._0_4_ = fVar18 - fVar2;
  auVar15._8_4_ = fVar16 - fVar4;
  auVar15._12_4_ = fVar13 - fVar1;
  auVar15 = divps(auVar14,auVar15);
  fVar13 = auVar15._0_4_;
  fVar16 = auVar15._4_4_;
  fVar17 = auVar15._8_4_;
  fVar18 = auVar15._12_4_;
  (c->color).m_data[0] =
       (float)((uVar9 & 0x3f800000 | ~uVar9 & (uint)((3.0 - (fVar13 + fVar13)) * fVar13 * fVar13)) &
              -(uint)(fVar2 < fVar5));
  (c->color).m_data[1] =
       (float)((uVar10 & 0x3f800000 | ~uVar10 & (uint)((3.0 - (fVar16 + fVar16)) * fVar16 * fVar16))
              & -(uint)(fVar3 < fVar8));
  (c->color).m_data[2] =
       (float)((uVar11 & 0x3f800000 | ~uVar11 & (uint)((3.0 - (fVar17 + fVar17)) * fVar17 * fVar17))
              & -(uint)(fVar4 < fVar7));
  (c->color).m_data[3] =
       (float)((uVar12 & 0x3f800000 | ~uVar12 & (uint)((3.0 - (fVar18 + fVar18)) * fVar18 * fVar18))
              & -(uint)(fVar1 < fVar6));
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }